

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MacroArgumentDefaultSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroArgumentDefaultSyntax,slang::parsing::Token&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,Token *args,TokenList *args_1)

{
  Info *pIVar1;
  SyntaxNode *pSVar2;
  size_t sVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  MacroArgumentDefaultSyntax *pMVar9;
  
  pMVar9 = (MacroArgumentDefaultSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MacroArgumentDefaultSyntax *)this->endPtr < pMVar9 + 1) {
    pMVar9 = (MacroArgumentDefaultSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pMVar9 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  (pMVar9->super_SyntaxNode).kind = MacroArgumentDefault;
  (pMVar9->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pMVar9->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pMVar9->equals).kind = TVar4;
  (pMVar9->equals).field_0x2 = uVar5;
  (pMVar9->equals).numFlags = (NumericTokenFlags)NVar6.raw;
  (pMVar9->equals).rawLen = uVar7;
  (pMVar9->equals).info = pIVar1;
  uVar8 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pMVar9->tokens).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pMVar9->tokens).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar8;
  (pMVar9->tokens).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (pMVar9->tokens).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_1->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pMVar9->tokens).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c8270;
  (pMVar9->tokens).super_SyntaxListBase.childCount = (args_1->super_SyntaxListBase).childCount;
  sVar3 = (args_1->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (pMVar9->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args_1->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  (pMVar9->tokens).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pMVar9->tokens).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005c81b0;
  (pMVar9->tokens).super_SyntaxListBase.super_SyntaxNode.parent = &pMVar9->super_SyntaxNode;
  return pMVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }